

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void write_sms_palette_file(Config config,char *filename,Image *input_image)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  ostream *poVar4;
  char local_22c [3];
  byte local_229;
  int local_228;
  char buf [3];
  uint8_t c;
  int i;
  ostream local_218 [8];
  ofstream out;
  Image *input_image_local;
  char *filename_local;
  
  std::ofstream::ofstream(local_218);
  std::ofstream::open((char *)local_218,(_Ios_Openmode)filename);
  if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
    std::operator<<(local_218,".db");
  }
  for (local_228 = 0; local_228 < 0x10; local_228 = local_228 + 1) {
    bVar1 = convert_colour_channel_to_2bit(input_image->palette[local_228].red);
    uVar2 = convert_colour_channel_to_2bit(input_image->palette[local_228].green);
    uVar3 = convert_colour_channel_to_2bit(input_image->palette[local_228].blue);
    local_229 = bVar1 | uVar2 << 2 | uVar3 << 4;
    if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
      sprintf(local_22c,"%02X",(ulong)local_229);
      poVar4 = std::operator<<(local_218," $");
      std::operator<<(poVar4,local_22c);
    }
    else {
      std::ostream::write((char *)local_218,(long)&local_229);
    }
  }
  if (((undefined1  [72])config & (undefined1  [72])0x1000000000000) == (undefined1  [72])0x0) {
    std::operator<<(local_218,"\n");
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void write_sms_palette_file(Config config, const char *filename, Image *input_image) {
    std::ofstream out;
    out.open(filename, config.output_bin ?
        std::ofstream::binary : std::ofstream::out);

    if (!config.output_bin) out << ".db";

    for (int i = 0; i < MAX_COLOURS; i++) {
        uint8_t c = (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].red)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].green) << 2)
                   | (convert_colour_channel_to_2bit((uint8_t) input_image->palette[i].blue) << 4));

        if (!config.output_bin) {
            char buf[3];
            sprintf(buf, "%02X", c);
            out << " $" << buf;
        } else out.write((const char*)&c, 1);
    }
    if (!config.output_bin) out << "\n";

    out.close();
}